

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

void __thiscall gui::DialogBox::setTitle(DialogBox *this,shared_ptr<gui::Label> *title)

{
  bool bVar1;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Label,void>
            (local_30,&title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = ContainerBase::hasChild((ContainerBase *)this,(shared_ptr<gui::Widget> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  if (!bVar1) {
    std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Label,void>
              (local_40,&title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
    (*(this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[2])(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  Widget::setFocusable
            (&((title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Widget,false);
  std::__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->title_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>,
             &title->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  updateTitle(this);
  return;
}

Assistant:

void DialogBox::setTitle(std::shared_ptr<Label> title) {
    if (!hasChild(title)) {
        addChild(title);
    }
    title->setFocusable(false);
    title_ = title;
    updateTitle();
}